

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O2

ZSTD_DStream * duckdb_zstd::ZSTD_initStaticDStream(void *workspace,size_t workspaceSize)

{
  ZSTD_DCtx *pZVar1;
  
  pZVar1 = ZSTD_initStaticDCtx(workspace,workspaceSize);
  return pZVar1;
}

Assistant:

ZSTD_DStream* ZSTD_initStaticDStream(void *workspace, size_t workspaceSize)
{
    return ZSTD_initStaticDCtx(workspace, workspaceSize);
}